

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn_arm.c
# Opt level: O3

uc_err uc_arm_context_save(uc_struct_conflict *uc,uc_context *context)

{
  uint uVar1;
  CPUState *pCVar2;
  TranslationBlock *pTVar3;
  uint *puVar4;
  uint *puVar5;
  ulong uVar6;
  
  pCVar2 = uc->cpu;
  memcpy(&context->field_0x14,pCVar2->env_ptr,(long)uc->cpu_context_size);
  uVar1 = *(uint *)((long)pCVar2[1].tb_jmp_cache + 0x3184);
  uVar6 = (ulong)uVar1;
  pTVar3 = pCVar2[1].tb_jmp_cache[0x5f4];
  puVar4 = (uint *)((long)&context[1].context_size + (long)uc->cpu_context_size);
  if (pTVar3 == (TranslationBlock *)0x0) {
    *(uint *)(&context->field_0x14 + uc->cpu_context_size) = 0;
  }
  else {
    *(uint *)(&context->field_0x14 + uc->cpu_context_size) = uVar1;
    memcpy(puVar4,pTVar3,uVar6 * 4);
    puVar4 = puVar4 + uVar6;
  }
  pTVar3 = pCVar2[1].tb_jmp_cache[0x5f5];
  puVar5 = puVar4 + 1;
  if (pTVar3 == (TranslationBlock *)0x0) {
    *puVar4 = 0;
  }
  else {
    *puVar4 = uVar1;
    memcpy(puVar5,pTVar3,uVar6 * 4);
    puVar5 = puVar5 + uVar6;
  }
  pTVar3 = pCVar2[1].tb_jmp_cache[0x5f6];
  puVar4 = puVar5 + 1;
  if (pTVar3 == (TranslationBlock *)0x0) {
    *puVar5 = 0;
  }
  else {
    *puVar5 = uVar1;
    memcpy(puVar4,pTVar3,uVar6 * 4);
    puVar4 = puVar4 + uVar6;
  }
  pTVar3 = pCVar2[1].tb_jmp_cache[0x5f8];
  puVar5 = puVar4 + 1;
  if (pTVar3 == (TranslationBlock *)0x0) {
    *puVar4 = 0;
  }
  else {
    *puVar4 = uVar1;
    memcpy(puVar5,pTVar3,uVar6 * 4);
    puVar5 = puVar5 + uVar6;
  }
  pTVar3 = pCVar2[1].tb_jmp_cache[0x5f9];
  puVar4 = puVar5 + 1;
  if (pTVar3 == (TranslationBlock *)0x0) {
    *puVar5 = 0;
  }
  else {
    *puVar5 = uVar1;
    memcpy(puVar4,pTVar3,uVar6 * 4);
    puVar4 = puVar4 + uVar6;
  }
  pTVar3 = pCVar2[1].tb_jmp_cache[0x5fa];
  puVar5 = puVar4 + 1;
  if (pTVar3 == (TranslationBlock *)0x0) {
    *puVar4 = 0;
  }
  else {
    *puVar4 = uVar1;
    memcpy(puVar5,pTVar3,uVar6 * 4);
    puVar5 = puVar5 + uVar6;
  }
  pTVar3 = pCVar2[1].tb_jmp_cache[0x5fb];
  puVar4 = puVar5 + 1;
  if (pTVar3 == (TranslationBlock *)0x0) {
    *puVar5 = 0;
  }
  else {
    *puVar5 = uVar1;
    memcpy(puVar4,pTVar3,uVar6 * 4);
    puVar4 = puVar4 + uVar6;
  }
  uVar1 = *(uint *)(pCVar2[1].tb_jmp_cache + 0x631);
  uVar6 = (ulong)uVar1;
  pTVar3 = pCVar2[1].tb_jmp_cache[0x5fe];
  puVar5 = puVar4 + 1;
  if (pTVar3 == (TranslationBlock *)0x0) {
    *puVar4 = 0;
  }
  else {
    *puVar4 = uVar1;
    memcpy(puVar5,pTVar3,uVar6 * 4);
    puVar5 = puVar5 + uVar6;
  }
  pTVar3 = pCVar2[1].tb_jmp_cache[0x5ff];
  if (pTVar3 == (TranslationBlock *)0x0) {
    *puVar5 = 0;
  }
  else {
    *puVar5 = uVar1;
    memcpy(puVar5 + 1,pTVar3,uVar6 * 4);
  }
  return UC_ERR_OK;
}

Assistant:

static uc_err uc_arm_context_save(struct uc_struct *uc, uc_context *context)
{
    char *p = NULL;
    ARMCPU *cpu = (ARMCPU *)uc->cpu;
    CPUARMState *env = (CPUARMState *)&cpu->env;
    uint32_t nr = 0;

#define ARM_ENV_SAVE(field)                                                    \
    if (!field) {                                                              \
        *(uint32_t *)p = 0;                                                    \
        p += sizeof(uint32_t);                                                 \
    } else {                                                                   \
        *(uint32_t *)p = nr;                                                   \
        p += sizeof(uint32_t);                                                 \
        memcpy(p, (void *)field, sizeof(uint32_t) * nr);                       \
        p += sizeof(uint32_t) * nr;                                            \
    }
    p = context->data;
    memcpy(p, uc->cpu->env_ptr, uc->cpu_context_size);
    p += uc->cpu_context_size;

    nr = cpu->pmsav7_dregion;
    ARM_ENV_SAVE(env->pmsav7.drbar)
    ARM_ENV_SAVE(env->pmsav7.drsr)
    ARM_ENV_SAVE(env->pmsav7.dracr)
    ARM_ENV_SAVE(env->pmsav8.rbar[M_REG_NS])
    ARM_ENV_SAVE(env->pmsav8.rbar[M_REG_S])
    ARM_ENV_SAVE(env->pmsav8.rlar[M_REG_NS])
    ARM_ENV_SAVE(env->pmsav8.rlar[M_REG_S])

    nr = cpu->sau_sregion;
    ARM_ENV_SAVE(env->sau.rbar)
    ARM_ENV_SAVE(env->sau.rlar)

#undef ARM_ENV_SAVE
    return UC_ERR_OK;
}